

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  char *pcVar1;
  char extraout_DL;
  char chr;
  char extraout_DL_00;
  char *pcVar2;
  ostringstream os;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar1 = (txt->_M_dataplus)._M_p;
  chr = extraout_DL;
  for (pcVar2 = pcVar1; pcVar2 != pcVar1 + txt->_M_string_length; pcVar2 = pcVar2 + 1) {
    transformed_abi_cxx11_(&local_1c0,(lest *)(ulong)(uint)(int)*pcVar2,chr);
    std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    pcVar1 = (txt->_M_dataplus)._M_p;
    chr = extraout_DL_00;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_tran_string( std::string const & txt )
{
    std::ostringstream os;
    for( std::string::const_iterator pos = txt.begin(); pos != txt.end(); ++pos )
        os << transformed( *pos );
    return os.str();
}